

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::FluctuatingChargeAtomTypesSectionParser::parseLine
          (FluctuatingChargeAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ForceFieldOptions *pFVar5;
  bool bVar6;
  int iVar7;
  FluctuatingTypeEnum FVar8;
  AtomType *pAVar9;
  char *__format;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *this_00;
  uint uVar10;
  RealType chargeMass;
  RealType RVar11;
  RealType RVar12;
  RealType RVar13;
  FluctuatingChargeAdapter fqa;
  RealType coefficient;
  FixedChargeAdapter fca;
  string atomTypeName;
  StringTokenizer tokenizer;
  FluctuatingChargeAdapter local_150;
  double local_148;
  undefined1 local_140 [32];
  _Base_ptr local_120;
  size_t local_118;
  RealType local_110;
  string local_108;
  StringTokenizer local_e8;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_60;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_140," ;\t\n\r",(allocator<char> *)&local_108);
  StringTokenizer::StringTokenizer(&local_e8,line,(string *)local_140);
  std::__cxx11::string::~string((string *)local_140);
  iVar7 = StringTokenizer::countTokens(&local_e8);
  if (iVar7 < 3) {
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  pFVar5 = this->options_;
  dVar1 = (pFVar5->FluctuatingChargeEnergyUnitScaling).data_;
  this->eus_ = dVar1;
  dVar2 = (pFVar5->ChargeUnitScaling).data_;
  this->cus_ = dVar2;
  this->dus_ = (pFVar5->DistanceUnitScaling).data_;
  this->oss_ = (pFVar5->OxidationStateScaling).data_;
  StringTokenizer::nextToken_abi_cxx11_(&local_108,&local_e8);
  pAVar9 = ForceField::getAtomType(ff,&local_108);
  if (pAVar9 == (AtomType *)0x0) {
    snprintf(painCave.errMsg,2000,
             "FluctuatingChargeAtomTypesSectionParser Error: Atom Type [%s] has not been created yet\n"
             ,local_108._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    local_140._0_8_ = pAVar9;
    bVar6 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)local_140);
    if (!bVar6) {
      FixedChargeAdapter::makeFixedCharge((FixedChargeAdapter *)local_140,0.0);
    }
  }
  chargeMass = StringTokenizer::nextTokenAsDouble(&local_e8);
  StringTokenizer::nextToken_abi_cxx11_((string *)local_140,&local_e8);
  FVar8 = getFluctuatingTypeEnum(this,(string *)local_140);
  std::__cxx11::string::~string((string *)local_140);
  if (FVar8 == fqtHardness) {
    if (6 < iVar7) {
      RVar11 = StringTokenizer::nextTokenAsDouble(&local_e8);
      local_110 = StringTokenizer::nextTokenAsDouble(&local_e8);
      iVar7 = StringTokenizer::nextTokenAsInt(&local_e8);
      RVar12 = StringTokenizer::nextTokenAsDouble(&local_e8);
      local_140._0_8_ = pAVar9;
      FluctuatingChargeAdapter::makeFluctuatingCharge
                ((FluctuatingChargeAdapter *)local_140,chargeMass,(dVar1 / dVar2) * RVar11,
                 (dVar1 / (dVar2 * dVar2)) * local_110,iVar7,RVar12 / this->dus_);
      goto LAB_001eb3e1;
    }
LAB_001eb279:
    __format = "FluctuatingChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n";
LAB_001eb289:
    snprintf(painCave.errMsg,2000,__format,(ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    if (FVar8 == fqtEAMPolynomial) {
      if ((iVar7 - 3U & 1) == 0 || iVar7 < 6) goto LAB_001eb279;
      RVar11 = StringTokenizer::nextTokenAsDouble(&local_e8);
      local_140._24_8_ = local_140 + 8;
      local_140._8_4_ = _S_red;
      local_140._16_8_ = 0;
      local_118 = 0;
      uVar10 = iVar7 - 4U >> 1;
      local_120 = (_Base_ptr)local_140._24_8_;
      while (bVar6 = uVar10 != 0, uVar10 = uVar10 - 1, bVar6) {
        iVar7 = StringTokenizer::nextTokenAsInt(&local_e8);
        RVar12 = StringTokenizer::nextTokenAsDouble(&local_e8);
        dVar1 = this->eus_;
        local_148 = pow(this->cus_,(double)iVar7);
        local_148 = (RVar12 * dVar1) / local_148;
        Polynomial<double>::setCoefficient((Polynomial<double> *)local_140,iVar7,&local_148);
      }
      local_150.at_ = pAVar9;
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::_Rb_tree(&local_60,
                 (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                  *)local_140);
      FluctuatingChargeAdapter::makeFluctuatingCharge
                (&local_150,chargeMass,RVar11,(DoublePolynomial *)&local_60);
      this_00 = &local_60;
    }
    else {
      if (FVar8 != fqtDREAM2) {
        __format = 
        "FluctuatingChargeAtomTypesSectionParser Error: Unknown Fluctuating Charge Type at line %d\n"
        ;
        goto LAB_001eb289;
      }
      if ((iVar7 - 3U & 1) != 0 || iVar7 < 6) goto LAB_001eb279;
      RVar11 = StringTokenizer::nextTokenAsDouble(&local_e8);
      dVar1 = this->oss_;
      RVar12 = StringTokenizer::nextTokenAsDouble(&local_e8);
      dVar2 = this->oss_;
      local_140._24_8_ = local_140 + 8;
      local_140._8_4_ = _S_red;
      local_140._16_8_ = 0;
      local_118 = 0;
      uVar10 = iVar7 - 5U >> 1;
      local_120 = (_Base_ptr)local_140._24_8_;
      while (bVar6 = uVar10 != 0, uVar10 = uVar10 - 1, bVar6) {
        iVar7 = StringTokenizer::nextTokenAsInt(&local_e8);
        dVar3 = this->oss_;
        RVar13 = StringTokenizer::nextTokenAsDouble(&local_e8);
        dVar4 = this->eus_;
        local_148 = pow(this->oss_ * this->cus_,(double)iVar7);
        local_148 = (dVar3 * dVar3 * RVar13 * dVar4) / local_148;
        Polynomial<double>::setCoefficient((Polynomial<double> *)local_140,iVar7,&local_148);
      }
      local_150.at_ = pAVar9;
      std::
      _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
      ::_Rb_tree(&local_90,
                 (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                  *)local_140);
      FluctuatingChargeAdapter::makeFluctuatingCharge
                (&local_150,chargeMass,RVar11 * dVar1,RVar12 * dVar2,(DoublePolynomial *)&local_90);
      this_00 = &local_90;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(this_00);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 *)local_140);
  }
LAB_001eb3e1:
  std::__cxx11::string::~string((string *)&local_108);
  StringTokenizer::~StringTokenizer(&local_e8);
  return;
}

Assistant:

void FluctuatingChargeAtomTypesSectionParser::parseLine(ForceField& ff,
                                                          const string& line,
                                                          int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    if (nTokens < 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }

    // conversion to kcal / mol
    eus_ = options_.getFluctuatingChargeEnergyUnitScaling();
    // conversion to electrons
    cus_ = options_.getChargeUnitScaling();
    // conversion to angstroms
    dus_ = options_.getDistanceUnitScaling();
    // oxidation state scaling
    oss_ = options_.getOxidationStateScaling();

    // electronegativity conversion
    RealType chius = eus_ / cus_;
    // curvature (hardness) conversion
    RealType curvus = eus_ / (cus_ * cus_);

    string atomTypeName = tokenizer.nextToken();
    AtomType* atomType  = ff.getAtomType(atomTypeName);
    if (atomType != NULL) {
      FixedChargeAdapter fca = FixedChargeAdapter(atomType);

      // All fluctuating charges are charges, and if we haven't
      // already set values for the charge, then start with zero.
      if (!fca.isFixedCharge()) {
        RealType charge = 0.0;
        fca.makeFixedCharge(charge);
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeAtomTypesSectionParser Error: Atom Type [%s] "
               "has not been created yet\n",
               atomTypeName.c_str());
      painCave.isFatal = 1;
      simError();
    }

    RealType chargeMass     = tokenizer.nextTokenAsDouble();
    FluctuatingTypeEnum fqt = getFluctuatingTypeEnum(tokenizer.nextToken());

    nTokens -= 3;

    switch (fqt) {
    case fqtHardness:
      // For Rick, Stuart, Berne style fluctuating charges, there's a
      // self charge potential defined by electronegativity and
      // hardness. On molecular structures, the slater-type overlap
      // integral is used to compute the hardness.

      // atomTypeName, chargeMass, Hardness, electronegativity,
      //   hardness (Jii), slaterN, slaterZeta

      if (nTokens < 4) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeAtomTypesSectionParser Error: "
                 "Not enough tokens at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType chi        = chius * tokenizer.nextTokenAsDouble();
        RealType Jii        = curvus * tokenizer.nextTokenAsDouble();
        int slaterN         = tokenizer.nextTokenAsInt();
        RealType slaterZeta = tokenizer.nextTokenAsDouble() / dus_;

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        fqa.makeFluctuatingCharge(chargeMass, chi, Jii, slaterN, slaterZeta);
      }
      break;

    case fqtEAMPolynomial:

      // For DR-EAM v1, oxidation state scaling is built in to
      // fluctuating charge parameters and nValence.

      if (nTokens < 3 || nTokens % 2 != 1) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeAtomTypesSectionParser Error: "
                 "Not enough tokens at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType nValence = tokenizer.nextTokenAsDouble();
        nTokens -= 1;

        DoublePolynomial vself;

        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = tokenizer.nextTokenAsDouble() * eus_ / pow(cus_, power);
          vself.setCoefficient(power, coefficient);
        }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        fqa.makeFluctuatingCharge(chargeMass, nValence, vself);
      }
      break;

    case fqtDREAM2:

      // For DR-EAM v2, oxidation state scaling (oss_) is a force
      // field parameter, fluctuating charge parameters, nValence, and
      // nMobile in the force field file should assume unit charge
      // oxidation state fits to ionization states and electron
      // affinities.

      if (nTokens < 3 || nTokens % 2 != 0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeAtomTypesSectionParser Error: "
                 "Not enough tokens at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        // Neutral atom valence count
        RealType nValence = tokenizer.nextTokenAsDouble() * oss_;
        nTokens -= 1;
        // Mobile electron count
        RealType nMobile = tokenizer.nextTokenAsDouble() * oss_;
        nTokens -= 1;

        DoublePolynomial vself;

        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = oss_ * oss_ * tokenizer.nextTokenAsDouble() * eus_ /
                        pow(oss_ * cus_, power);

          vself.setCoefficient(power, coefficient);
        }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);

        fqa.makeFluctuatingCharge(chargeMass, nValence, nMobile, vself);
      }
      break;

    case fqtUnknown:
    default:
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FluctuatingChargeAtomTypesSectionParser Error: "
               "Unknown Fluctuating Charge Type at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
      break;
    }
  }